

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::copyFromBaseCE32
          (CollationDataBuilder *this,UChar32 c,uint32_t ce32,UBool withContext,
          UErrorCode *errorCode)

{
  uint32_t *puVar1;
  int64_t *piVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  UChar *pUVar7;
  UnicodeString *src;
  int64_t ce;
  undefined1 local_230 [8];
  UnicodeString context_1;
  ConditionalCE32 head_1;
  UChar *p_1;
  undefined1 local_188 [8];
  Iterator prefixes;
  ConditionalCE32 *cond;
  uint32_t local_100;
  int32_t index;
  undefined1 local_f0 [8];
  UnicodeString context;
  ConditionalCE32 head;
  UChar *p;
  int32_t length_1;
  int64_t *baseCEs;
  int32_t length;
  uint32_t *baseCE32s;
  UErrorCode *errorCode_local;
  uint32_t local_20;
  UBool withContext_local;
  uint32_t ce32_local;
  UChar32 c_local;
  CollationDataBuilder *this_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    UVar3 = Collation::isSpecialCE32(ce32);
    uVar6 = ce32;
    if (UVar3 != '\0') {
      iVar4 = Collation::tagFromCE32(ce32);
      local_20 = ce32;
      switch(iVar4) {
      case 1:
      case 2:
      case 4:
        break;
      default:
        break;
      case 5:
        puVar1 = this->base->ce32s;
        iVar4 = Collation::indexFromCE32(ce32);
        iVar5 = Collation::lengthFromCE32(ce32);
        local_20 = encodeExpansion32(this,(int32_t *)(puVar1 + iVar4),iVar5,errorCode);
        break;
      case 6:
        piVar2 = this->base->ces;
        iVar4 = Collation::indexFromCE32(ce32);
        iVar5 = Collation::lengthFromCE32(ce32);
        local_20 = encodeExpansion(this,piVar2 + iVar4,iVar5,errorCode);
        break;
      case 8:
        pUVar7 = this->base->contexts;
        iVar4 = Collation::indexFromCE32(ce32);
        pUVar7 = pUVar7 + iVar4;
        local_20 = CollationData::readCE32(pUVar7);
        if (withContext == '\0') {
          uVar6 = copyFromBaseCE32(this,c,local_20,'\0',errorCode);
          return uVar6;
        }
        ConditionalCE32::ConditionalCE32((ConditionalCE32 *)((long)&context.fUnion + 0x30));
        UnicodeString::UnicodeString((UnicodeString *)local_f0,L'\0');
        UVar3 = Collation::isContractionCE32(local_20);
        if (UVar3 == '\0') {
          local_20 = copyFromBaseCE32(this,c,local_20,'\x01',errorCode);
          local_100 = addConditionalCE32(this,(UnicodeString *)local_f0,local_20,errorCode);
          head.defaultCE32 = local_100;
        }
        else {
          local_100 = copyContractionsFromBaseCE32
                                (this,(UnicodeString *)local_f0,c,local_20,
                                 (ConditionalCE32 *)((long)&context.fUnion + 0x30),errorCode);
        }
        UVar3 = ::U_FAILURE(*errorCode);
        if (UVar3 == '\0') {
          prefixes.stack_ = (UVector32 *)getConditionalCE32(this,local_100);
          ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&p_1,pUVar7 + 2);
          UCharsTrie::Iterator::Iterator((Iterator *)local_188,(ConstChar16Ptr *)&p_1,0,errorCode);
          ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&p_1);
          while (UVar3 = UCharsTrie::Iterator::next((Iterator *)local_188,errorCode), UVar3 != '\0')
          {
            src = UCharsTrie::Iterator::getString((Iterator *)local_188);
            UnicodeString::operator=((UnicodeString *)local_f0,src);
            UnicodeString::reverse((UnicodeString *)local_f0);
            iVar4 = UnicodeString::length((UnicodeString *)local_f0);
            UnicodeString::insert((UnicodeString *)local_f0,0,(char16_t)iVar4);
            local_20 = UCharsTrie::Iterator::getValue((Iterator *)local_188);
            UVar3 = Collation::isContractionCE32(local_20);
            if (UVar3 == '\0') {
              local_20 = copyFromBaseCE32(this,c,local_20,'\x01',errorCode);
              local_100 = addConditionalCE32(this,(UnicodeString *)local_f0,local_20,errorCode);
              *(uint32_t *)&prefixes.stack_[2].field_0x14 = local_100;
            }
            else {
              local_100 = copyContractionsFromBaseCE32
                                    (this,(UnicodeString *)local_f0,c,local_20,
                                     (ConditionalCE32 *)prefixes.stack_,errorCode);
            }
            UVar3 = ::U_FAILURE(*errorCode);
            if (UVar3 != '\0') {
              this_local._4_4_ = 0;
              cond._4_4_ = 1;
              goto LAB_00294e44;
            }
            prefixes.stack_ = (UVector32 *)getConditionalCE32(this,local_100);
          }
          local_20 = makeBuilderContextCE32(head.defaultCE32);
          UnicodeSet::add(&this->contextChars,c);
          cond._4_4_ = 2;
LAB_00294e44:
          UCharsTrie::Iterator::~Iterator((Iterator *)local_188);
        }
        else {
          this_local._4_4_ = 0;
          cond._4_4_ = 1;
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_f0);
        ConditionalCE32::~ConditionalCE32((ConditionalCE32 *)((long)&context.fUnion + 0x30));
        if (cond._4_4_ == 1) {
          return this_local._4_4_;
        }
        break;
      case 9:
        if (withContext == '\0') {
          pUVar7 = this->base->contexts;
          iVar4 = Collation::indexFromCE32(ce32);
          uVar6 = CollationData::readCE32(pUVar7 + iVar4);
          uVar6 = copyFromBaseCE32(this,c,uVar6,'\0',errorCode);
          return uVar6;
        }
        ConditionalCE32::ConditionalCE32((ConditionalCE32 *)((long)&context_1.fUnion + 0x30));
        UnicodeString::UnicodeString((UnicodeString *)local_230,L'\0');
        copyContractionsFromBaseCE32
                  (this,(UnicodeString *)local_230,c,ce32,
                   (ConditionalCE32 *)((long)&context_1.fUnion + 0x30),errorCode);
        local_20 = makeBuilderContextCE32(head_1.defaultCE32);
        UnicodeSet::add(&this->contextChars,c);
        UnicodeString::~UnicodeString((UnicodeString *)local_230);
        ConditionalCE32::~ConditionalCE32((ConditionalCE32 *)((long)&context_1.fUnion + 0x30));
        break;
      case 0xc:
        *errorCode = U_UNSUPPORTED_ERROR;
        break;
      case 0xe:
        local_20 = getCE32FromOffsetCE32(this,'\x01',c,ce32);
        break;
      case 0xf:
        ce = Collation::unassignedCEFromCodePoint(c);
        local_20 = encodeOneCE(this,ce,errorCode);
      }
      this_local._4_4_ = local_20;
      uVar6 = this_local._4_4_;
    }
  }
  else {
    this_local._4_4_ = 0;
    uVar6 = this_local._4_4_;
  }
  this_local._4_4_ = uVar6;
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationDataBuilder::copyFromBaseCE32(UChar32 c, uint32_t ce32, UBool withContext,
                                       UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(!Collation::isSpecialCE32(ce32)) { return ce32; }
    switch(Collation::tagFromCE32(ce32)) {
    case Collation::LONG_PRIMARY_TAG:
    case Collation::LONG_SECONDARY_TAG:
    case Collation::LATIN_EXPANSION_TAG:
        // copy as is
        break;
    case Collation::EXPANSION32_TAG: {
        const uint32_t *baseCE32s = base->ce32s + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);
        ce32 = encodeExpansion32(
            reinterpret_cast<const int32_t *>(baseCE32s), length, errorCode);
        break;
    }
    case Collation::EXPANSION_TAG: {
        const int64_t *baseCEs = base->ces + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);
        ce32 = encodeExpansion(baseCEs, length, errorCode);
        break;
    }
    case Collation::PREFIX_TAG: {
        // Flatten prefixes and nested suffixes (contractions)
        // into a linear list of ConditionalCE32.
        const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
        ce32 = CollationData::readCE32(p);  // Default if no prefix match.
        if(!withContext) {
            return copyFromBaseCE32(c, ce32, FALSE, errorCode);
        }
        ConditionalCE32 head;
        UnicodeString context((UChar)0);
        int32_t index;
        if(Collation::isContractionCE32(ce32)) {
            index = copyContractionsFromBaseCE32(context, c, ce32, &head, errorCode);
        } else {
            ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
            head.next = index = addConditionalCE32(context, ce32, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        ConditionalCE32 *cond = getConditionalCE32(index);  // the last ConditionalCE32 so far
        UCharsTrie::Iterator prefixes(p + 2, 0, errorCode);
        while(prefixes.next(errorCode)) {
            context = prefixes.getString();
            context.reverse();
            context.insert(0, (UChar)context.length());
            ce32 = (uint32_t)prefixes.getValue();
            if(Collation::isContractionCE32(ce32)) {
                index = copyContractionsFromBaseCE32(context, c, ce32, cond, errorCode);
            } else {
                ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
                cond->next = index = addConditionalCE32(context, ce32, errorCode);
            }
            if(U_FAILURE(errorCode)) { return 0; }
            cond = getConditionalCE32(index);
        }
        ce32 = makeBuilderContextCE32(head.next);
        contextChars.add(c);
        break;
    }
    case Collation::CONTRACTION_TAG: {
        if(!withContext) {
            const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
            ce32 = CollationData::readCE32(p);  // Default if no suffix match.
            return copyFromBaseCE32(c, ce32, FALSE, errorCode);
        }
        ConditionalCE32 head;
        UnicodeString context((UChar)0);
        copyContractionsFromBaseCE32(context, c, ce32, &head, errorCode);
        ce32 = makeBuilderContextCE32(head.next);
        contextChars.add(c);
        break;
    }
    case Collation::HANGUL_TAG:
        errorCode = U_UNSUPPORTED_ERROR;  // We forbid tailoring of Hangul syllables.
        break;
    case Collation::OFFSET_TAG:
        ce32 = getCE32FromOffsetCE32(TRUE, c, ce32);
        break;
    case Collation::IMPLICIT_TAG:
        ce32 = encodeOneCE(Collation::unassignedCEFromCodePoint(c), errorCode);
        break;
    default:
        U_ASSERT(FALSE);  // require ce32 == base->getFinalCE32(ce32)
        break;
    }
    return ce32;
}